

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

int glfwInit(void)

{
  int iVar1;
  GLFWbool GVar2;
  int iVar3;
  char **ppcVar4;
  bool bVar5;
  
  iVar3 = 1;
  if (_glfw.initialized == 0) {
    iVar3 = 0;
    memset(&_glfw,0,0x20980);
    _glfw.hints.init.hatButtons = _glfwInitHints.hatButtons;
    _glfw.hints.init.ns.menubar = _glfwInitHints.ns.menubar;
    _glfw.hints.init.ns.chdir = _glfwInitHints.ns.chdir;
    iVar1 = _glfwPlatformInit();
    if (iVar1 == 0) {
      terminate();
    }
    else {
      GVar2 = _glfwPlatformCreateMutex(&_glfw.errorLock);
      if (((GVar2 != 0) && (GVar2 = _glfwPlatformCreateTls(&_glfw.errorSlot), GVar2 != 0)) &&
         (GVar2 = _glfwPlatformCreateTls(&_glfw.contextSlot), GVar2 != 0)) {
        _glfwPlatformSetTls(&_glfw.errorSlot,&_glfwMainThreadError);
        _glfw.initialized = 1;
        _glfw.timer.offset = _glfwPlatformGetTimerValue();
        glfwDefaultWindowHints();
        bVar5 = _glfwDefaultMappings[0] == (char *)0x0;
        if (!bVar5) {
          iVar3 = glfwUpdateGamepadMappings(_glfwDefaultMappings[0]);
          if (iVar3 != 0) {
            ppcVar4 = _glfwDefaultMappings;
            do {
              ppcVar4 = ppcVar4 + 1;
              bVar5 = *ppcVar4 == (char *)0x0;
              if (bVar5) goto LAB_00154ec9;
              iVar3 = glfwUpdateGamepadMappings(*ppcVar4);
            } while (iVar3 != 0);
          }
          terminate();
        }
LAB_00154ec9:
        return (uint)bVar5;
      }
      terminate();
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));
    _glfw.hints.init = _glfwInitHints;

    if (!_glfwPlatformInit())
    {
        terminate();
        return GLFW_FALSE;
    }

    if (!_glfwPlatformCreateMutex(&_glfw.errorLock) ||
        !_glfwPlatformCreateTls(&_glfw.errorSlot) ||
        !_glfwPlatformCreateTls(&_glfw.contextSlot))
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfwPlatformSetTls(&_glfw.errorSlot, &_glfwMainThreadError);

    _glfw.initialized = GLFW_TRUE;
    _glfw.timer.offset = _glfwPlatformGetTimerValue();

    glfwDefaultWindowHints();

    {
        int i;

        for (i = 0;  _glfwDefaultMappings[i];  i++)
        {
            if (!glfwUpdateGamepadMappings(_glfwDefaultMappings[i]))
            {
                terminate();
                return GLFW_FALSE;
            }
        }
    }

    return GLFW_TRUE;
}